

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O2

int main(int argc,char **argv)

{
  int verbose;
  long lStack_10;
  
  if (argc != 2) {
    if (((argc == 3) && (*argv[1] == '-')) && (argv[1][1] == 'v')) {
      verbose = 1;
      lStack_10 = 0x10;
      goto LAB_00101319;
    }
    usage(*argv);
  }
  verbose = 0;
  lStack_10 = 8;
LAB_00101319:
  check_sysout(*(char **)((long)argv + lStack_10),verbose);
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
    switch (argc) {
    case 2:
        check_sysout(argv[1], 0);
        break;
    case 3:
        if (0 == strncmp(argv[1], "-v", 2)) {
            check_sysout(argv[2], 1);
        } else {
            usage(argv[0]);
        }
        break;
    default:
        usage(argv[0]);
    }
  exit(0);
}